

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts2-lace.c
# Opt level: O0

void lace_parseParams(int *argc_p,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_24;
  int local_20;
  int j;
  int i;
  int argc;
  char **argv_local;
  int *argc_p_local;
  
  iVar1 = *argc_p;
  for (local_20 = 1; iVar3 = local_20, local_20 != iVar1; local_20 = local_20 + 2) {
    iVar2 = strcmp("-w",argv[local_20]);
    if (iVar2 == 0) {
      iVar3 = local_20 + 1;
      if (iVar3 == iVar1) break;
      _lace_workers = atoi(argv[iVar3]);
    }
    else {
      iVar2 = strcmp("-q",argv[local_20]);
      if ((iVar2 != 0) || (iVar3 = local_20 + 1, iVar3 == iVar1)) break;
      _lace_dqsize = atoi(argv[iVar3]);
    }
  }
  local_20 = iVar3;
  for (local_24 = 1; local_24 <= iVar1 - local_20; local_24 = local_24 + 1) {
    argv[local_24] = argv[local_20 + -1 + local_24];
  }
  *argc_p = (iVar1 - local_20) + 1;
  return;
}

Assistant:

void lace_parseParams(int* argc_p, char *argv[])
{
  int argc = *argc_p;

  int i=1;

  while (1) {
    if (i == argc) break;
    if (strcmp("-w", argv[i])==0) {
      i++;
      if (i == argc) break;
      _lace_workers = atoi(argv[i]);
    }
    else if (strcmp("-q", argv[i])==0) {
      i++;
      if (i == argc) break;
      _lace_dqsize = atoi(argv[i]);
    }
    else break;
    i++;
  }

  int j;
  for (j=1;j <= argc - i;j++) argv[j] = argv[i - 1 + j];
  *argc_p = argc - i + 1;
}